

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  _Rb_tree_header *p_Var2;
  LogMessage *pLVar3;
  long *plVar4;
  mapped_type *pmVar5;
  long *plVar6;
  int **ppiVar7;
  size_type *psVar8;
  int iVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  long lVar12;
  string error;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  key_type local_14c;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  string local_128;
  EnumDescriptorProto *local_108;
  DescriptorBuilder *local_100;
  long local_f8;
  undefined1 local_f0 [16];
  int *local_e0;
  _Alloc_hider _Stack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  LogMessage local_68;
  
  local_108 = proto;
  local_100 = this;
  if (0 < *(int *)(enm + 0x2c)) {
    iVar9 = 0;
    do {
      if ((local_108->value_).super_RepeatedPtrFieldBase.current_size_ <= iVar9) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)local_f0,pLVar3);
        internal::LogMessage::~LogMessage(&local_68);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)(enm + 0x2c));
  }
  if (((*(byte *)(*(long *)(enm + 0x20) + 0x60) & 1) == 0) ||
     (*(char *)(*(long *)(enm + 0x20) + 0x58) == '\0')) {
    p_Var2 = &local_98._M_impl.super__Rb_tree_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    if (0 < *(int *)(enm + 0x2c)) {
      lVar12 = 0;
      do {
        iVar9 = *(int *)(*(long *)(enm + 0x30) + 0x10 + lVar12 * 0x28);
        p_Var10 = &p_Var2->_M_header;
        for (p_Var11 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
            p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < iVar9]) {
          if (iVar9 <= (int)*(size_t *)(p_Var11 + 1)) {
            p_Var10 = p_Var11;
          }
        }
        p_Var11 = &p_Var2->_M_header;
        if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
           (p_Var11 = p_Var10, iVar9 < (int)p_Var10[1]._M_color)) {
          p_Var11 = &p_Var2->_M_header;
        }
        lVar1 = *(long *)(enm + 0x30) + lVar12 * 0x28;
        if ((_Rb_tree_header *)p_Var11 == p_Var2) {
          local_f0._0_4_ = *(undefined4 *)(lVar1 + 0x10);
          local_f8 = lVar12;
          pmVar5 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_98,(key_type *)local_f0);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          lVar12 = local_f8;
        }
        else {
          std::operator+(&local_b8,"\"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar1 + 8));
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_148 = &local_138;
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_138 = *plVar6;
            lStack_130 = plVar4[3];
          }
          else {
            local_138 = *plVar6;
            local_148 = (long *)*plVar4;
          }
          local_140 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          local_14c = *(key_type *)(lVar1 + 0x10);
          pmVar5 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_98,&local_14c);
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_148,(ulong)(pmVar5->_M_dataplus)._M_p);
          ppiVar7 = (int **)(plVar4 + 2);
          if ((int **)*plVar4 == ppiVar7) {
            local_e0 = *ppiVar7;
            _Stack_d8._M_p = (pointer)plVar4[3];
            local_f0._0_8_ = &local_e0;
          }
          else {
            local_e0 = *ppiVar7;
            local_f0._0_8_ = (int **)*plVar4;
          }
          local_f0._8_8_ = plVar4[1];
          *plVar4 = (long)ppiVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)local_f0);
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          psVar8 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_128.field_2._M_allocated_capacity = *psVar8;
            local_128.field_2._8_8_ = plVar4[3];
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar8;
            local_128._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_128._M_string_length = plVar4[1];
          *plVar4 = (long)psVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if ((int **)local_f0._0_8_ != &local_e0) {
            operator_delete((void *)local_f0._0_8_,(long)local_e0 + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (*(char *)(*(long *)(enm + 0x20) + 0x58) == '\0') {
            AddError(local_100,*(string **)(enm + 8),&local_108->super_Message,NUMBER,&local_128);
          }
          else {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_f0,LOGLEVEL_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                       ,0x1039);
            pLVar3 = internal::LogMessage::operator<<((LogMessage *)local_f0,&local_128);
            internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar3);
            internal::LogMessage::~LogMessage((LogMessage *)local_f0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < *(int *)(enm + 0x2c));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_98);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    map<int, string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] + "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER,
                   error);
        } else {
          // Generate warning if duplicated values are found but the option
          // isn't set.
          GOOGLE_LOG(ERROR) << error;
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}